

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayoutInfo::tabContentRect(QDockAreaLayoutInfo *this)

{
  QSize QVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  QRect QVar5;
  
  if (this->tabbed == true) {
    uVar3 = *(ulong *)&this->rect;
    uVar2 = *(ulong *)&(this->rect).x2;
    uVar4 = uVar3 >> 0x20;
    QVar1 = tabBarSizeHint(this);
    if (QVar1 != (QSize)0x0) {
      switch(this->tabBarShape) {
      case 0:
      case 4:
        uVar4 = (ulong)(uint)((int)(uVar3 >> 0x20) + QVar1.ht.m_i.m_i);
        break;
      case 1:
      case 5:
        uVar2 = uVar2 & 0xffffffff |
                uVar2 - ((ulong)QVar1 & 0xffffffff00000000) & 0xffffffff00000000;
        break;
      case 2:
      case 6:
        uVar3 = uVar3 + (long)QVar1;
        break;
      case 3:
      case 7:
        uVar2 = uVar2 & 0xffffffff00000000 | (ulong)(uint)((int)uVar2 - QVar1.wd.m_i);
      }
    }
  }
  else {
    uVar2 = 0xffffffffffffffff;
    uVar4 = 0;
    uVar3 = 0;
  }
  QVar5._0_8_ = uVar3 & 0xffffffff | uVar4 << 0x20;
  QVar5.x2.m_i = (int)uVar2;
  QVar5.y2.m_i = (int)(uVar2 >> 0x20);
  return QVar5;
}

Assistant:

QRect QDockAreaLayoutInfo::tabContentRect() const
{
    if (!tabbed)
        return QRect();

    QRect result = rect;
    QSize tbh = tabBarSizeHint();

    if (!tbh.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::TriangularNorth:
                result.adjust(0, tbh.height(), 0, 0);
                break;
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularSouth:
                result.adjust(0, 0, 0, -tbh.height());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::TriangularEast:
                result.adjust(0, 0, -tbh.width(), 0);
                break;
            case QTabBar::RoundedWest:
            case QTabBar::TriangularWest:
                result.adjust(tbh.width(), 0, 0, 0);
                break;
            default:
                break;
        }
    }

    return result;
}